

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O1

void __thiscall
prevector_tests::prevector_tester<8U,_int>::resize(prevector_tester<8U,_int> *this,Size s)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<int,_std::allocator<int>_>::resize(&this->real_vector,(ulong)s);
  this->passed = (bool)(this->passed &
                       (long)(this->real_vector).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->real_vector).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2 == (ulong)s);
  prevector<8U,_int,_unsigned_int,_int>::resize(&this->pre_vector,s);
  uVar1 = (this->pre_vector)._size;
  uVar3 = uVar1 - 9;
  if (uVar1 < 9) {
    uVar3 = uVar1;
  }
  this->passed = (bool)(this->passed & uVar3 == s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    test(this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize(Size s) {
        real_vector.resize(s);
        local_check_equal(real_vector.size(), s);
        pre_vector.resize(s);
        local_check_equal(pre_vector.size(), s);
        test();
    }